

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorPoolManager::DisposePool
          (DescriptorPoolManager *this,DescriptorPoolWrapper *Pool,Uint64 QueueMask)

{
  RenderDeviceVkImpl *this_00;
  DescriptorPoolDeleter local_40;
  Uint64 local_20;
  Uint64 QueueMask_local;
  DescriptorPoolWrapper *Pool_local;
  DescriptorPoolManager *this_local;
  
  this_00 = this->m_DeviceVkImpl;
  local_20 = QueueMask;
  QueueMask_local = (Uint64)Pool;
  Pool_local = (DescriptorPoolWrapper *)this;
  DisposePool(VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::
  VulkanHandleTypeId)14>&&,unsigned_long)::DescriptorPoolDeleter::DescriptorPoolDeleter(Diligent::
  DescriptorPoolManager&,VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::
  VulkanHandleTypeId_14>___(&local_40,this,Pool);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<Diligent::DescriptorPoolManager::DisposePool(VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>&&,unsigned_long)::DescriptorPoolDeleter,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_00,&local_40,local_20);
  DisposePool::DescriptorPoolDeleter::~DescriptorPoolDeleter(&local_40);
  return;
}

Assistant:

void DescriptorPoolManager::DisposePool(VulkanUtilities::DescriptorPoolWrapper&& Pool, Uint64 QueueMask)
{
    class DescriptorPoolDeleter
    {
    public:
        // clang-format off
        DescriptorPoolDeleter(DescriptorPoolManager&                   _PoolMgr,
                              VulkanUtilities::DescriptorPoolWrapper&& _Pool) noexcept :
            PoolMgr {&_PoolMgr       },
            Pool    {std::move(_Pool)}
        {}

        DescriptorPoolDeleter            (const DescriptorPoolDeleter&) = delete;
        DescriptorPoolDeleter& operator= (const DescriptorPoolDeleter&) = delete;
        DescriptorPoolDeleter& operator= (      DescriptorPoolDeleter&&)= delete;

        DescriptorPoolDeleter(DescriptorPoolDeleter&& rhs)noexcept :
            PoolMgr {rhs.PoolMgr        },
            Pool    {std::move(rhs.Pool)}
        {
            rhs.PoolMgr = nullptr;
        }
        // clang-format on

        ~DescriptorPoolDeleter()
        {
            if (PoolMgr != nullptr)
            {
                PoolMgr->FreePool(std::move(Pool));
            }
        }

    private:
        DescriptorPoolManager*                 PoolMgr;
        VulkanUtilities::DescriptorPoolWrapper Pool;
    };

    m_DeviceVkImpl.SafeReleaseDeviceObject(DescriptorPoolDeleter{*this, std::move(Pool)}, QueueMask);
}